

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswRarity.c
# Opt level: O1

int Ssw_RarManObjIsConst(void *pMan,Aig_Obj_t *pObj)

{
  int iVar1;
  long lVar2;
  
  if (*(int *)(*(long *)(*(long *)((long)pMan + 0x10) + 0x20) + 4) <= pObj->Id) {
    __assert_fail("Id < Aig_ManObjNumMax(p->pAig)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswRarity.c"
                  ,0x53,"word *Ssw_RarObjSim(Ssw_RarMan_t *, int)");
  }
  iVar1 = *(int *)(*pMan + 4);
  if (0 < (long)iVar1) {
    lVar2 = 0;
    do {
      if (*(long *)((long)(pObj->Id * iVar1) * 8 + *(long *)((long)pMan + 0x28) + lVar2 * 8) !=
          (*(long *)&pObj->field_0x18 << 0x3c) >> 0x3f) {
        return 0;
      }
      lVar2 = lVar2 + 1;
    } while (iVar1 != lVar2);
  }
  return 1;
}

Assistant:

int Ssw_RarManObjIsConst( void * pMan, Aig_Obj_t * pObj )
{
    Ssw_RarMan_t * p = (Ssw_RarMan_t *)pMan;
    word * pSim = Ssw_RarObjSim( p, Aig_ObjId(pObj) );
    word Flip = pObj->fPhase ? ~(word)0 : 0;
    int w;
    for ( w = 0; w < p->pPars->nWords; w++ )
        if ( pSim[w] ^ Flip )
            return 0;
    return 1;
}